

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

string * __thiscall cppcms::widgets::base_text::value_abi_cxx11_(base_text *this)

{
  bool bVar1;
  cppcms_error *this_00;
  long *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = base_widget::set((base_widget *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
  if (!bVar1) {
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Value was not loaded",&local_31);
    cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 1));
  return in_RDI;
}

Assistant:

std::string base_text::value()
{
	if(!set())
		throw cppcms_error("Value was not loaded");
	return value_;
}